

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::to_string<char[6],nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
          (string *__return_storage_ptr__,lest *this,char (*lhs) [6],string *op,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  ostream *poVar1;
  char **txt;
  basic_string_view<char,_std::char_traits<char>_> v;
  ostringstream os;
  undefined1 local_1e1;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  lest *local_1a0;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a0 = this;
  to_string_abi_cxx11_(&local_1e0,(lest *)&local_1a0,txt);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  v.size_ = (size_type)&local_1e1;
  v.data_ = (const_pointer)op->_M_string_length;
  nonstd::sv_lite::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_1c0,(sv_lite *)(op->_M_dataplus)._M_p,v,(allocator<char> *)rhs);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,local_1e0.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1e0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1e0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,local_1e0.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_1e0._M_string_length;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}